

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O2

value * helics::fileops::loadToml(value *__return_storage_ptr__,string *tomlString)

{
  string fname;
  char cVar1;
  undefined8 in_stack_fffffffffffffda0;
  spec in_stack_fffffffffffffda8;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  ifstream file;
  
  if (tomlString->_M_string_length < 0x81) {
    std::ifstream::ifstream(&file,(string *)tomlString,_S_bin);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      loadTomlStr(__return_storage_ptr__,tomlString);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffda8,"unknown file",
                 (allocator<char> *)&stack0xfffffffffffffda7);
      toml::spec::default_version();
      fname._M_string_length = uStack_230;
      fname._M_dataplus._M_p = (pointer)local_238;
      fname.field_2._M_allocated_capacity = local_228;
      fname.field_2._8_8_ = in_stack_fffffffffffffda0;
      toml::parse<toml::type_config>
                (__return_storage_ptr__,(istream *)&file,fname,in_stack_fffffffffffffda8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
    }
    std::ifstream::~ifstream(&file);
  }
  else {
    loadTomlStr(__return_storage_ptr__,tomlString);
  }
  return __return_storage_ptr__;
}

Assistant:

toml::value loadToml(const std::string& tomlString)
{
    if (tomlString.size() > 128) {
        try {
            return loadTomlStr(tomlString);
        }
        catch (const std::invalid_argument&) {
            ;  // just pass through this was an assumption
        }
    }
    std::ifstream file(tomlString, std::ios_base::binary);

    try {
        if (file.is_open()) {
            return toml::parse(file);
        }
        return loadTomlStr(tomlString);
    }
    catch (const toml::exception& se) {
        throw(std::invalid_argument(se.what()));
    }
}